

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O3

void __thiscall
duckdb::Bit::NumericToBit<duckdb::uhugeint_t>(Bit *this,uhugeint_t numeric,bitstring_t *output_str)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [11];
  undefined1 auVar34 [15];
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  char *pcVar40;
  bitstring_t *str;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  str = (bitstring_t *)numeric.upper;
  uVar41 = numeric.lower;
  if ((str->value).pointer.length < 0xd) {
    pcVar40 = (str->value).pointer.prefix;
  }
  else {
    pcVar40 = (str->value).pointer.ptr;
  }
  *pcVar40 = '\0';
  auVar18._8_6_ = 0;
  auVar18._0_8_ = this;
  auVar18[0xe] = (char)((ulong)this >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = this;
  auVar20[0xc] = (char)((ulong)this >> 0x30);
  auVar20._13_2_ = auVar18._13_2_;
  auVar22._8_4_ = 0;
  auVar22._0_8_ = this;
  auVar22._12_3_ = auVar20._12_3_;
  auVar24._8_2_ = 0;
  auVar24._0_8_ = this;
  auVar24[10] = (char)((ulong)this >> 0x28);
  auVar24._11_4_ = auVar22._11_4_;
  auVar26._8_2_ = 0;
  auVar26._0_8_ = this;
  auVar26._10_5_ = auVar24._10_5_;
  auVar28[8] = (char)((ulong)this >> 0x20);
  auVar28._0_8_ = this;
  auVar28._9_6_ = auVar26._9_6_;
  auVar43[7] = 0;
  auVar43._0_7_ = auVar28._8_7_;
  auVar32._7_8_ = 0;
  auVar32._0_7_ = auVar28._8_7_;
  auVar36._1_8_ = SUB158(auVar32 << 0x40,7);
  auVar36[0] = (char)((ulong)this >> 0x18);
  auVar36._9_6_ = 0;
  auVar33._1_10_ = SUB1510(auVar36 << 0x30,5);
  auVar33[0] = (char)((ulong)this >> 0x10);
  auVar37._11_4_ = 0;
  auVar37._0_11_ = auVar33;
  auVar31._3_12_ = SUB1512(auVar37 << 0x20,3);
  auVar31[2] = (char)((ulong)this >> 8);
  auVar31[1] = 0;
  auVar31[0] = (byte)this;
  auVar43._8_4_ = auVar31._0_4_;
  auVar43._12_4_ = auVar33._0_4_;
  auVar42 = pshuflw(auVar43,auVar43,0x1b);
  auVar43 = pshufhw(auVar42,auVar42,0x1b);
  auVar17._8_6_ = 0;
  auVar17._0_8_ = uVar41;
  auVar17[0xe] = numeric.lower._7_1_;
  auVar19._8_4_ = 0;
  auVar19._0_8_ = uVar41;
  auVar19[0xc] = numeric.lower._6_1_;
  auVar19._13_2_ = auVar17._13_2_;
  auVar21._8_4_ = 0;
  auVar21._0_8_ = uVar41;
  auVar21._12_3_ = auVar19._12_3_;
  auVar23._8_2_ = 0;
  auVar23._0_8_ = uVar41;
  auVar23[10] = numeric.lower._5_1_;
  auVar23._11_4_ = auVar21._11_4_;
  auVar25._8_2_ = 0;
  auVar25._0_8_ = uVar41;
  auVar25._10_5_ = auVar23._10_5_;
  auVar27[8] = numeric.lower._4_1_;
  auVar27._0_8_ = uVar41;
  auVar27._9_6_ = auVar25._9_6_;
  auVar42[7] = 0;
  auVar42._0_7_ = auVar27._8_7_;
  auVar34._7_8_ = 0;
  auVar34._0_7_ = auVar27._8_7_;
  auVar38._1_8_ = SUB158(auVar34 << 0x40,7);
  auVar38[0] = numeric.lower._3_1_;
  auVar38._9_6_ = 0;
  auVar35._1_10_ = SUB1510(auVar38 << 0x30,5);
  auVar35[0] = numeric.lower._2_1_;
  auVar39._11_4_ = 0;
  auVar39._0_11_ = auVar35;
  auVar29[2] = numeric.lower._1_1_;
  auVar29._0_2_ = (ushort)numeric.lower;
  auVar29._3_12_ = SUB1512(auVar39 << 0x20,3);
  auVar30._2_13_ = auVar29._2_13_;
  auVar30._0_2_ = (ushort)numeric.lower & 0xff;
  auVar42._8_4_ = auVar30._0_4_;
  auVar42._12_4_ = auVar35._0_4_;
  auVar42 = pshuflw(auVar42,auVar42,0x1b);
  auVar42 = pshufhw(auVar42,auVar42,0x1b);
  sVar1 = auVar42._0_2_;
  sVar2 = auVar42._2_2_;
  sVar3 = auVar42._4_2_;
  sVar4 = auVar42._6_2_;
  sVar5 = auVar42._8_2_;
  sVar6 = auVar42._10_2_;
  sVar7 = auVar42._12_2_;
  sVar8 = auVar42._14_2_;
  sVar9 = auVar43._0_2_;
  sVar10 = auVar43._2_2_;
  sVar11 = auVar43._4_2_;
  sVar12 = auVar43._6_2_;
  sVar13 = auVar43._8_2_;
  sVar14 = auVar43._10_2_;
  sVar15 = auVar43._12_2_;
  sVar16 = auVar43._14_2_;
  pcVar40[1] = (0 < sVar1) * (sVar1 < 0x100) * auVar42[0] - (0xff < sVar1);
  pcVar40[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar42[2] - (0xff < sVar2);
  pcVar40[3] = (0 < sVar3) * (sVar3 < 0x100) * auVar42[4] - (0xff < sVar3);
  pcVar40[4] = (0 < sVar4) * (sVar4 < 0x100) * auVar42[6] - (0xff < sVar4);
  pcVar40[5] = (0 < sVar5) * (sVar5 < 0x100) * auVar42[8] - (0xff < sVar5);
  pcVar40[6] = (0 < sVar6) * (sVar6 < 0x100) * auVar42[10] - (0xff < sVar6);
  pcVar40[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar42[0xc] - (0xff < sVar7);
  pcVar40[8] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[0xe] - (0xff < sVar8);
  pcVar40[9] = (0 < sVar9) * (sVar9 < 0x100) * auVar43[0] - (0xff < sVar9);
  pcVar40[10] = (0 < sVar10) * (sVar10 < 0x100) * auVar43[2] - (0xff < sVar10);
  pcVar40[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar43[4] - (0xff < sVar11);
  pcVar40[0xc] = (0 < sVar12) * (sVar12 < 0x100) * auVar43[6] - (0xff < sVar12);
  pcVar40[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar43[8] - (0xff < sVar13);
  pcVar40[0xe] = (0 < sVar14) * (sVar14 < 0x100) * auVar43[10] - (0xff < sVar14);
  pcVar40[0xf] = (0 < sVar15) * (sVar15 < 0x100) * auVar43[0xc] - (0xff < sVar15);
  pcVar40[0x10] = (0 < sVar16) * (sVar16 < 0x100) * auVar43[0xe] - (0xff < sVar16);
  Finalize(str);
  return;
}

Assistant:

void Bit::NumericToBit(T numeric, bitstring_t &output_str) {
	D_ASSERT(output_str.GetSize() >= sizeof(T) + 1);

	auto output = output_str.GetDataWriteable();
	auto data = const_data_ptr_cast(&numeric);

	*output = 0; // set padding to 0
	++output;
	for (idx_t idx = 0; idx < sizeof(T); ++idx) {
		output[idx] = static_cast<char>(data[sizeof(T) - idx - 1]);
	}
	Bit::Finalize(output_str);
}